

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

attr * SEM_Exp(ast *node)

{
  int iVar1;
  ast *paVar2;
  ast *paVar3;
  ast *a_00;
  attr *paVar4;
  attr *paVar5;
  basic_t *pbVar6;
  ast *in_RDI;
  char *s2;
  char *s1;
  field_t *structField;
  char buf [24];
  attr *b;
  attr *a;
  ast *child3;
  ast *child2;
  ast *child1;
  void *local_70;
  void *local_68;
  field_t *local_60;
  char local_58 [8];
  char **in_stack_ffffffffffffffb0;
  char **in_stack_ffffffffffffffb8;
  attr *in_stack_ffffffffffffffc0;
  ast *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  attr *in_stack_fffffffffffffff8;
  
  paVar2 = child(in_RDI,1);
  paVar3 = child(in_RDI,2);
  a_00 = child(in_RDI,3);
  iVar1 = paVar2->type;
  if (iVar1 == -0x26fd) {
    paVar5 = SEM_Exp(paVar2);
    if (paVar5 == (attr *)0x0) {
      paVar5 = (attr *)0x0;
    }
    else if ((paVar3->type == 0x112) || (paVar3->type == 0x10e)) {
      if (paVar3->type == 0x112) {
        if (paVar5->kind == 1) {
          paVar4 = SEM_Exp(paVar2);
          if ((paVar4->kind == 0) && (((paVar4->field_1).basic)->type == 2)) {
            paVar5 = (attr *)((paVar5->field_1).basic)->name;
          }
          else {
            paVar2 = child(a_00,1);
            if (paVar2->type == 0x103) {
              paVar2 = child(a_00,1);
              sprintf(local_58,"\"%lg\"",paVar2->val->numval);
            }
            else {
              strcpy(local_58,"Array argument");
            }
            semerror(0xc,(int)(ulong)(uint)a_00->pos->first_line,semErrorMsg[0xc],local_58);
            paVar5 = (attr *)0x0;
          }
        }
        else {
          semerror(10,(int)(ulong)(uint)paVar2->pos->first_line,semErrorMsg[10]);
          paVar5 = (attr *)0x0;
        }
      }
      else if (paVar5->kind == 2) {
        local_60 = ((paVar5->field_1).structure)->field;
        while ((local_60 != (field_t *)0x0 &&
               (iVar1 = strcmp(local_60->name,a_00->val->typeval), iVar1 != 0))) {
          local_60 = local_60->next;
        }
        if (local_60 == (field_t *)0x0) {
          semerror(0xe,(int)(ulong)(uint)a_00->pos->first_line,semErrorMsg[0xe],a_00->val->numval);
          paVar5 = (attr *)0x0;
        }
        else {
          paVar5 = local_60->type;
        }
      }
      else {
        semerror(0xd,(int)(ulong)(uint)paVar3->pos->first_line,semErrorMsg[0xd]);
        paVar5 = (attr *)0x0;
      }
    }
    else {
      paVar4 = SEM_Exp(paVar2);
      if (paVar3->type == 0x106) {
        if (((paVar5->kind == 0) && (((paVar5->field_1).basic)->name == (char *)0x0)) ||
           (paVar5->kind == 3)) {
          semerror(6,(int)(ulong)(uint)paVar2->pos->first_line,semErrorMsg[6]);
          paVar5 = (attr *)0x0;
        }
        else if ((paVar4 != (attr *)0x0) &&
                (iVar1 = isequal(in_stack_fffffffffffffff8,(attr *)in_RDI), iVar1 == 0)) {
          semerror(5,(int)(ulong)(uint)paVar3->pos->first_line,semErrorMsg[5]);
          paVar5 = (attr *)0x0;
        }
      }
      else if ((paVar4 != (attr *)0x0) &&
              (iVar1 = isequal(in_stack_fffffffffffffff8,(attr *)in_RDI), iVar1 == 0)) {
        semerror(7,(int)(ulong)(uint)paVar3->pos->first_line,semErrorMsg[7]);
        paVar5 = (attr *)0x0;
      }
    }
  }
  else if (iVar1 - 0x102U < 2) {
    paVar5 = (attr *)malloc(0x10);
    paVar5->kind = 0;
    pbVar6 = (basic_t *)malloc(0x10);
    (paVar5->field_1).basic = pbVar6;
    iVar1 = 5;
    if (paVar2->type == 0x102) {
      iVar1 = 2;
    }
    ((paVar5->field_1).basic)->type = iVar1;
    ((paVar5->field_1).basic)->name = (char *)0x0;
  }
  else if ((iVar1 == 0x109) || (iVar1 == 0x10f)) {
    paVar5 = SEM_Exp(paVar2);
  }
  else if (iVar1 == 0x110) {
    paVar5 = SEM_Exp(paVar2);
  }
  else {
    if (iVar1 != 0x11c) {
      abort();
    }
    paVar5 = findvar(in_stack_ffffffffffffffd0);
    if (a_00 == (ast *)0x0) {
      if (paVar5 == (attr *)0x0) {
        semerror(1,(int)(ulong)(uint)paVar2->pos->first_line,semErrorMsg[1],paVar2->val->numval);
      }
    }
    else if (paVar5 == (attr *)0x0) {
      paVar5 = findfunc((char *)0x0);
      if (paVar5 == (attr *)0x0) {
        semerror(2,(int)(ulong)(uint)paVar2->pos->first_line,semErrorMsg[2],paVar2->val->numval);
      }
      else {
        iVar1 = isFuncMatch(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
        if (iVar1 == 0) {
          semerror(9,(int)(ulong)(uint)paVar2->pos->first_line,semErrorMsg[9],local_68,local_70);
          free(local_68);
          free(local_70);
        }
      }
    }
    else {
      semerror(0xb,(int)(ulong)(uint)paVar2->pos->first_line,semErrorMsg[0xb],paVar2->val->numval);
      paVar5 = (attr *)0x0;
    }
  }
  return paVar5;
}

Assistant:

static struct attr* SEM_Exp(struct ast *node) {
    struct ast *child1 = child(node, 1);
    struct ast *child2 = child(node, 2);
    struct ast *child3 = child(node, 3);
    struct attr *a, *b;
    switch (child1->type) {
        case Exp:
            a = SEM_Exp(child1);
            if (a == NULL)
                return NULL;
            if (child2->type != LB && child2->type != DOT) {
                b = SEM_Exp(child3);
                if (child2->type == ASSIGNOP) {
                    if ((a->kind == BASIC && a->basic->name == NULL) || a->kind == FUNCTION) {
                        SEMERROR_NOVA(AssignLeftValue, child1);
                        return NULL;
                    } else if (b && !isequal(a, b)) { //error not match
//                    printf("error type not match\n");
                        SEMERROR_NOVA(AssignMismatch, child2);
                        return NULL;
                    }
                } else { //DONETODO: other types
                    if (b && !isequal(a, b)) { //error not match
//                    printf("error type not match\n");
                        SEMERROR_NOVA(OperandsMismatch, child2);
                        return NULL;
                    }
                }
                return a;
            }
            else if (child2->type == LB) {
                if (a->kind != ARRAY) { //DONETODO: error expected ARRAY
//                    printf("error expected ARRAY\n");
                    SEMERROR_NOVA(NotArray, child1);
                    return NULL;
                }
                b = SEM_Exp(child3);
                if (b->kind != BASIC || b->basic->type != INT_T) { //DONETODO: error expected int
//                    printf("error expected int\n");
                    char buf[24];
                    if (child(child3, 1)->type == FLOAT) {
                        sprintf(buf, "\"%lg\"", child(child3, 1)->val->fpval);
                    } else
                        strcpy(buf, "Array argument");
                    SEMERROR(NotInteger, child3, buf);
                    return NULL;
                }
                //UNKNOWNTODO: compose array type, REALLY NEED?
                return a->array->type;
            } else { // access struct field
                if (a->kind != STRUCTURE) { //DONETODO: error expected struct
//                    printf("error expected struct\n");
                    SEMERROR_NOVA(NotStruct, child2);
                    return NULL;
                }
                //DONETODO: search each field for ID
                struct field_t *structField = a->structure->field;
                for (; structField; structField = structField->next) {
                    if (strcmp(structField->name, child3->val->idval) == 0) {
                        break;
                    }
                }
                if (structField) {
                    return structField->type;
                } else {
                    SEMERROR(StructHasNoField, child3, child3->val->idval);
                    return NULL;
                }
            }
            break;
        case NOT:
        case MINUS:
            return SEM_Exp(child2);
        case ID:
            a = findvar(child1->val->idval);
            if (!child3) {
                if (a == NULL) { //DONETODO: error not found
                    //printf("error var not found: %s\n", child1->val->idval);
                    SEMERROR(UndefinedVariable, child1, child1->val->idval);
                }
                return a;
            }
            if (a) {
                SEMERROR(NotFunction, child1, child1->val->idval);
                return NULL;
            }
            a = findfunc(child1->val->idval);
            if (a == NULL) { //DONETODO: error func not decl
                //printf("error func not found: %s\n", child1->val->idval);
                SEMERROR(UndefinedFunction, child1, child1->val->idval);
                return a;
            }
            char *s1, *s2;
            if (!isFuncMatch(child1, a, &s1, &s2)) {
                //DONETODO check arg type
                SEMERROR(FunctionArgMismatch, child1, s1, s2);
                free(s1);
                free(s2);
//                return NULL;
            }
            return a;
        case INT:
        case FLOAT:
            a = malloc(sizeof(struct attr));
            a->kind = BASIC;
            a->basic = malloc(sizeof(struct basic_t));
            a->basic->type = child1->type == INT ? INT_T : FLOAT_T;
            a->basic->name = NULL;
            return a;
        case LP:
            return SEM_Exp(child2);
        default:
            break;
    }
    abort();
}